

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,1,1,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  void *pvVar4;
  ulong uVar5;
  unsigned_long uVar6;
  unsigned_long *puVar7;
  comm *comm_00;
  _Map_pointer pppVar8;
  _Map_pointer pppVar9;
  comm *comm_01;
  _Elt_pointer ppVar10;
  unsigned_long uVar11;
  _Elt_pointer ppVar12;
  _Elt_pointer ppVar13;
  _Elt_pointer ppVar14;
  _Elt_pointer ppVar15;
  ulong uVar16;
  _Elt_pointer ppVar17;
  size_t sVar18;
  pointer puVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar29;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1e8;
  _Elt_pointer local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_188;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_180;
  _Elt_pointer local_178;
  _Elt_pointer ppStack_170;
  _Elt_pointer local_168;
  _Elt_pointer ppStack_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  _Elt_pointer local_140;
  pair<unsigned_long,_unsigned_long> local_138;
  size_t local_128;
  ulong local_120;
  _Elt_pointer local_118;
  _Elt_pointer ppStack_110;
  comm *local_108;
  size_type local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Elt_pointer local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_180 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_168 = (_Elt_pointer)left_nsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1e8,0);
  local_100 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_108 = comm;
  uVar11 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_100,comm);
  lVar30 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar30 != 0) {
    lVar30 = lVar30 >> 3;
    do {
      ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar16 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar30 + -1];
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
            if (*(ulong *)(((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x1f0) <= uVar16) break;
            operator_delete(ppVar17);
            ppVar17 = (_Elt_pointer)
                      ((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
            ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar16)
            break;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12);
        ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12) {
          do {
            uVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar30 + -1];
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
              if (uVar3 != *(unsigned_long *)
                            (((_Elt_pointer)
                             ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                             -0x10))->second + 0x1f0)) break;
              operator_delete(ppVar17);
              ppVar17 = (_Elt_pointer)
                        ((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
              ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              if (uVar3 != local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12);
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((uVar11 - 1) + lVar30);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar30 + -1];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar30 = lVar30 + -1;
    } while (lVar30 != 0);
  }
  local_58.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_158,&local_58,&local_78,(allocator_type *)&local_98);
  pvVar4 = *(void **)local_180;
  *(pointer *)local_180 =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_180 + 8) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_180 + 0x10) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = nonsv;
  if ((pvVar4 != (void *)0x0) &&
     (operator_delete(pvVar4),
     local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_118 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_178 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar16 = ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)((_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                  (_Elt_pointer)0x0)) * 0x20;
  local_188 = right_nsv;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar17 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (uVar16 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; ppVar17 < pppVar9; ppVar17 = (_Elt_pointer)&ppVar17->second) {
    operator_delete((void *)ppVar17->second);
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_178;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_190;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_118;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar31 = 0;
    do {
      ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar25 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar31];
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
            if (*(ulong *)(((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x1f0) <= uVar25) break;
            operator_delete(ppVar17);
            ppVar17 = (_Elt_pointer)
                      ((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
            ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar25)
            break;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12);
        ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12) {
          do {
            uVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar31];
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
              if (uVar3 != *(unsigned_long *)
                            (((_Elt_pointer)
                             ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                             -0x10))->second + 0x1f0)) break;
              operator_delete(ppVar17);
              ppVar17 = (_Elt_pointer)
                        ((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
              ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              if (uVar3 != local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12);
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar31 + uVar11);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar31];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar31 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar32 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
           (_Elt_pointer)0x0;
  local_178 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_140 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_80 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_180,*(undefined8 *)(local_180 + 8));
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar30 = (long)ppVar17 - (long)local_178;
  local_178 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_120 = (local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar30 = (lVar30 >> 4) + ((long)ppVar12 - (long)local_190 >> 4) +
           (((uVar31 >> 3) - 1) + (ulong)bVar32) * 0x20;
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_110 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar14 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar17 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_108;
  if (lVar30 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; local_190 = ppVar14, local_118 = ppVar12, local_108 = comm_00, ppVar17 < pppVar8;
      ppVar17 = (_Elt_pointer)&ppVar17->second) {
    operator_delete((void *)ppVar17->second);
    ppVar12 = local_118;
    ppVar14 = local_190;
    comm_00 = local_108;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_178;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_118;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_110;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_190;
  if (lVar30 + uVar16 != *(long *)(local_180 + 8) - *(long *)local_180 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 1, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_158,&local_120,1,comm_00);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(long)comm_00->m_size,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_f8);
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)comm_00->m_size,(value_type_conflict *)&local_f8,
             (allocator_type *)&local_c8);
  comm_01 = local_108;
  pvVar29 = local_188;
  iVar1 = comm_00->m_rank;
  lVar30 = (long)iVar1;
  if (0 < lVar30) {
    uVar31 = *(ulong *)((long)local_158.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar30 * 8 + -8);
    local_190 = (_Elt_pointer)
                local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_178 = (_Elt_pointer)
                local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar20 = lVar30;
    lVar22 = 0;
    do {
      lVar21 = lVar20 + -1;
      uVar25 = lVar22 + 1U;
      if (lVar22 + 1U < uVar16) {
        uVar25 = uVar16;
      }
      uVar5 = *(ulong *)((long)local_158.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar20 * 8 + -8);
      lVar23 = lVar22 + -1;
      puVar28 = (ulong *)(lVar22 * 0x10 + *(long *)local_180);
      do {
        lVar24 = uVar25 - 1;
        if (lVar23 + (1 - uVar25) == -1) break;
        lVar24 = lVar23 + 1;
        uVar27 = *puVar28;
        lVar23 = lVar24;
        puVar28 = puVar28 + 2;
      } while (uVar5 <= uVar27);
      if (uVar5 <= uVar31) {
        *(long *)((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar21 * 8) =
             (lVar24 - lVar22) + 1;
        *(long *)((long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar21 * 8) = lVar22;
        uVar31 = uVar5;
        if (*(ulong *)((long)local_158.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar21 * 8) < local_120)
        break;
      }
      bVar32 = 1 < lVar20;
      lVar20 = lVar21;
      lVar22 = lVar24;
    } while (bVar32);
  }
  iVar2 = local_108->m_size;
  if (iVar1 < iVar2 + -1) {
    lVar20 = *(long *)local_180;
    uVar31 = ((unsigned_long *)
             ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar30];
    lVar30 = lVar30 + 1;
    uVar25 = (*(long *)(local_180 + 8) - lVar20 >> 4) - 1;
    do {
      uVar5 = local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar30];
      uVar27 = uVar25;
      if (uVar16 < uVar25) {
        puVar28 = (ulong *)(uVar25 * 0x10 + lVar20);
        uVar26 = uVar25;
        do {
          uVar27 = uVar26;
          if (*puVar28 < uVar5) break;
          uVar26 = uVar26 - 1;
          puVar28 = puVar28 + -2;
          uVar27 = uVar16;
        } while (uVar16 < uVar26);
      }
      if (uVar5 <= uVar31) {
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar30] = (uVar25 - uVar27) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar30] = uVar27;
        uVar31 = uVar5;
        if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar30] < local_120) break;
      }
      lVar30 = lVar30 + 1;
      uVar25 = uVar27;
    } while (iVar2 != (int)lVar30);
  }
  mxx::all2all<unsigned_long>(&local_f8,&local_98,local_108);
  mxx::impl::get_displacements<unsigned_long>(&local_c8,&local_f8);
  local_118 = (_Elt_pointer)
              (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish[-1] +
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_e0,(size_type)local_118,(allocator_type *)&local_138);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_180,&local_98,&local_b0,
             local_e0.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f8,&local_c8,comm_01);
  local_190 = (_Elt_pointer)
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_01->m_rank];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,local_100);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar29,local_100);
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_178 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_170 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  sVar18 = local_128;
  for (ppVar17 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
      local_128 = sVar18, ppVar17 < pppVar9; ppVar17 = (_Elt_pointer)&ppVar17->second) {
    operator_delete((void *)ppVar17->second);
    sVar18 = local_128;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  lVar30 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_178;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_170;
  if (lVar30 != 0) {
    lVar30 = lVar30 >> 3;
    local_178 = (_Elt_pointer)(uVar11 - 1);
    do {
      uVar3 = (long)&local_178->first + lVar30;
      lVar30 = lVar30 + -1;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar19 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          uVar16 = puVar19[lVar30];
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
            uVar6 = ((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            if (*(ulong *)(uVar6 + 0x1f0) <= uVar16) {
              if (uVar16 == *(ulong *)(uVar6 + 0x1f0)) {
                (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)
                ->_M_impl).super__Vector_impl_data._M_start[*(long *)(uVar6 + 0x1f8) - uVar11] =
                     uVar3;
                operator_delete(ppVar17);
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     (_Elt_pointer)
                     ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     (_Map_pointer)
                     &((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
              }
              break;
            }
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
            _M_impl).super__Vector_impl_data._M_start[*(long *)(uVar6 + 0x1f8) - uVar11] = uVar3;
            operator_delete(ppVar17);
            ppVar17 = (_Elt_pointer)
                      ((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar16) {
              if (uVar16 == local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
                (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)
                ->_M_impl).super__Vector_impl_data._M_start
                [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] =
                     uVar3;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
              break;
            }
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] = uVar3;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_138.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar30];
      local_138.second = uVar3;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_138);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar3;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar30 != 0);
  }
  ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_190 != (_Elt_pointer)0x0) {
    uVar16 = 0;
    local_178 = (_Elt_pointer)((long)local_190 << 4);
    do {
      if (ppVar17 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar7 = &(local_e0.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first;
      ppVar14 = local_178 + ~uVar16;
      uVar3 = *(unsigned_long *)((long)&local_178[~uVar16].second + (long)puVar7);
      ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      do {
        uVar31 = *(ulong *)((long)&ppVar14->first + (long)puVar7);
        if (ppVar17 == ppVar12) {
          uVar6 = ((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          if (*(ulong *)(uVar6 + 0x1f0) <= uVar31) {
            if (uVar31 == *(ulong *)(uVar6 + 0x1f0)) {
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
              _M_impl).super__Vector_impl_data._M_start[*(long *)(uVar6 + 0x1f8) - uVar11] = uVar3;
              operator_delete(ppVar12);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            break;
          }
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
          _M_impl).super__Vector_impl_data._M_start[*(long *)(uVar6 + 0x1f8) - uVar11] = uVar3;
          operator_delete(ppVar12);
          ppVar12 = (_Elt_pointer)
                    ((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
          ppVar17 = ppVar12 + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          if (ppVar17[-1].first <= uVar31) {
            if (uVar31 == ppVar17[-1].first) {
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
              _M_impl).super__Vector_impl_data._M_start[ppVar17[-1].second - uVar11] = uVar3;
              ppVar17 = ppVar17 + -1;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
            }
            break;
          }
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar17[-1].second - uVar11] = uVar3;
          ppVar17 = ppVar17 + -1;
        }
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
      } while (ppVar17 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      uVar16 = uVar16 + 1;
      sVar18 = local_128;
    } while ((_Elt_pointer)uVar16 != local_190);
  }
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_160 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar12 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar29 = local_188;
  if (ppVar17 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar19 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
              _M_impl).super__Vector_impl_data._M_start;
    ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVar15 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      if (ppVar17 == ppVar13) {
        ppVar13 = (_Elt_pointer)ppVar15[-1].second;
        ppVar15 = (_Elt_pointer)&ppVar15[-1].second;
        puVar19[ppVar13[0x1f].second - uVar11] = sVar18;
        ppVar17 = ppVar13 + 0x20;
      }
      else {
        puVar19[ppVar17[-1].second - uVar11] = sVar18;
      }
      ppVar17 = ppVar17 + -1;
      ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
    } while (ppVar17 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; local_168 = ppVar10, local_188 = pvVar29, ppVar12 < pppVar9;
      ppVar12 = (_Elt_pointer)&ppVar12->second) {
    operator_delete((void *)ppVar12->second);
    ppVar10 = local_168;
    pvVar29 = local_188;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  puVar19 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_168;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_160;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar19) {
    uVar16 = 0;
    do {
      uVar3 = uVar16 + uVar11;
      while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        uVar31 = puVar19[uVar16];
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          uVar6 = ((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          if (*(ulong *)(uVar6 + 0x1f0) <= uVar31) {
            if (uVar31 == *(ulong *)(uVar6 + 0x1f0)) {
              (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[*(long *)(uVar6 + 0x1f8) - uVar11] = uVar3;
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            break;
          }
          (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[*(long *)(uVar6 + 0x1f8) - uVar11] = uVar3;
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar31) {
            if (uVar31 == local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
              (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start
              [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] =
                   uVar3;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            break;
          }
          (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] = uVar3;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_138.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar16];
      local_138.second = uVar3;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_138);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar3;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar16 = uVar16 + 1;
      puVar19 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar19 >> 3
                             ));
  }
  ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_118 != local_190) {
    lVar20 = (long)local_118 - (long)local_190;
    lVar30 = 0;
    local_190 = (_Elt_pointer)((long)local_190 << 4);
    do {
      if (ppVar17 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar28 = (ulong *)((long)&local_e0.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar30].first +
                         (long)local_190);
      uVar3 = *(unsigned_long *)
               ((long)&local_e0.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar30].second + (long)local_190);
      do {
        uVar16 = *puVar28;
        if (ppVar17 == local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          uVar6 = ((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          if (*(ulong *)(uVar6 + 0x1f0) <= uVar16) {
            if (uVar16 == *(ulong *)(uVar6 + 0x1f0)) {
              (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[*(long *)(uVar6 + 0x1f8) - uVar11] = uVar3;
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            break;
          }
          (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[*(long *)(uVar6 + 0x1f8) - uVar11] = uVar3;
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          if (ppVar17[-1].first <= uVar16) {
            if (uVar16 == ppVar17[-1].first) {
              (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar17[-1].second - uVar11] = uVar3;
              ppVar17 = ppVar17 + -1;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
            }
            break;
          }
          (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar17[-1].second - uVar11] = uVar3;
          ppVar17 = ppVar17 + -1;
        }
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
      } while (ppVar17 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      lVar30 = lVar30 + 1;
      pvVar29 = local_188;
    } while (lVar30 != lVar20 + (ulong)(lVar20 == 0));
  }
  if (ppVar17 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar19 = (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppVar14 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar17 == ppVar12) {
        ppVar12 = (_Elt_pointer)ppVar14[-1].second;
        ppVar14 = (_Elt_pointer)&ppVar14[-1].second;
        puVar19[ppVar12[0x1f].second - uVar11] = local_128;
        ppVar17 = ppVar12 + 0x20;
      }
      else {
        puVar19[ppVar17[-1].second - uVar11] = local_128;
      }
      ppVar17 = ppVar17 + -1;
    } while (ppVar17 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_180,&local_e0);
  if (local_e0.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1e8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}